

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O2

void __thiscall Kernel::normalize(Kernel *this)

{
  int iVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  int x;
  long lVar5;
  float fVar6;
  
  iVar1 = this->width;
  lVar2 = (long)(this->height / -2);
  pfVar3 = (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start +
           (long)this->xoff + (this->yoff + lVar2) * (long)iVar1 + (long)(iVar1 / -2);
  fVar6 = 0.0;
  for (; pfVar4 = pfVar3, lVar5 = (long)(iVar1 / -2), lVar2 <= this->height / 2; lVar2 = lVar2 + 1)
  {
    for (; lVar5 <= iVar1 / 2; lVar5 = lVar5 + 1) {
      fVar6 = fVar6 + *pfVar4;
      pfVar4 = pfVar4 + 1;
    }
    pfVar3 = pfVar3 + iVar1;
  }
  this->scale = 1.0 / fVar6;
  return;
}

Assistant:

void Kernel::normalize() {
  float sum = 0.0f;
  for (int y = -height / 2; y <= height / 2; y++) {
    for (int x = -width / 2; x <= width / 2; x++) {
      sum += this->operator()(x, y);
    }
  }
  scale = 1 / sum;
}